

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,char_type *value)

{
  size_t in_RCX;
  void *in_RDX;
  char_type *in_RSI;
  arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler> *in_RDI;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  char cVar1;
  cstring_spec_handler local_28 [2];
  buffer<wchar_t> *local_8;
  
  if (in_RDI->specs_ == (format_specs *)0x0) {
    write(in_RDI,(int)in_RSI,in_RDX,in_RCX);
    local_8 = (buffer<wchar_t> *)
              out((arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
                   *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  else {
    cVar1 = in_RDI->specs_->type;
    cstring_spec_handler::cstring_spec_handler(local_28,in_RDI,in_RSI);
    handle_cstring_type_spec<char,fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<wchar_t>,fmt::v6::internal::error_handler>::cstring_spec_handler>
              ((char)((ulong)in_RDI >> 0x38),
               (cstring_spec_handler *)CONCAT17(cVar1,in_stack_ffffffffffffffc8));
    local_8 = (buffer<wchar_t> *)
              out((arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
                   *)CONCAT17(cVar1,in_stack_ffffffffffffffc8));
  }
  return (iterator)local_8;
}

Assistant:

iterator operator()(const char_type* value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(specs_->type,
                                       cstring_spec_handler(*this, value));
    return out();
  }